

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall
google::LogMessage::LogMessage(LogMessage *this,char *file,int line,CheckOpString *result)

{
  ostream *poVar1;
  
  this->allocated_ = (LogMessageData *)0x0;
  LogMessageTime::LogMessageTime(&this->time_);
  Init(this,file,line,FATAL,0x10aea0);
  poVar1 = std::operator<<(&(this->data_->stream_).super_ostream,"Check failed: ");
  poVar1 = std::operator<<(poVar1,(string *)result->str_);
  std::operator<<(poVar1," ");
  return;
}

Assistant:

LogMessage::LogMessage(const char* file, int line, const CheckOpString& result)
    : allocated_(nullptr) {
  Init(file, line, GLOG_FATAL, &LogMessage::SendToLog);
  stream() << "Check failed: " << (*result.str_) << " ";
}